

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::EntryPointInfo::CleanupNativeCode(EntryPointInfo *this,ScriptContext *scriptContext)

{
  Type *pp_Var1;
  JavascriptMethod p_Var2;
  JavascriptMethod p_Var3;
  
  p_Var2 = (JavascriptMethod)(this->super_ProxyEntryPointInfo).jsMethod;
  p_Var3 = GetNativeEntrypoint(this);
  if (p_Var2 == p_Var3) {
    pp_Var1 = &(this->super_ProxyEntryPointInfo).jsMethod;
    *(byte *)pp_Var1 = *(byte *)pp_Var1 | 1;
  }
  return;
}

Assistant:

void EntryPointInfo::CleanupNativeCode(ScriptContext * scriptContext)
    {
        if (this->jsMethod == this->GetNativeEntrypoint())
        {
#if DBG
            // tag the jsMethod in case the native address is reused in recycler and create a false positive
            // not checking validationCookie because this can happen while debugger attaching, native address
            // are batch freed through deleting NativeCodeGenerator
            this->jsMethod = (Js::JavascriptMethod)((intptr_t)this->jsMethod | 1);
#else
            this->jsMethod = nullptr;
#endif
        }
    }